

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O3

bool __thiscall
Rml::Context::ProcessMouseButtonDown(Context *this,int button_index,int key_modifier_state)

{
  Vector2i VVar1;
  bool bVar2;
  type this_00;
  Element *pEVar3;
  SystemInterface *pSVar4;
  ComputedValues *pCVar5;
  uint uVar6;
  Context *pCVar7;
  ScrollController *pSVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  float fVar11;
  Dictionary parameters;
  Dictionary scroll_parameters;
  Dictionary local_68;
  Dictionary local_48;
  
  local_68.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar7 = this;
  GenerateMouseEventParameters(this,&local_68,button_index);
  GenerateKeyModifierEventParameters(pCVar7,&local_68,key_modifier_state);
  pEVar3 = this->hover;
  if (button_index == 0) {
    if (pEVar3 == (Element *)0x0) {
      this->active = (Element *)0x0;
LAB_001e883e:
      VVar1 = this->last_click_mouse_position;
      iVar10 = (this->mouse_position).x;
      iVar9 = (this->mouse_position).y;
      fVar11 = this->density_independent_pixel_ratio;
      pSVar4 = GetSystemInterface();
      (*pSVar4->_vptr_SystemInterface[2])(pSVar4);
      if ((this->active != this->last_click_element) ||
         ((0.5 <= (float)((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) -
                         this->last_click_time) ||
          (iVar10 = iVar10 - VVar1.x, iVar9 = iVar9 - VVar1.y, fVar11 = fVar11 * 3.0,
          fVar11 * fVar11 <= (float)(iVar9 * iVar9 + iVar10 * iVar10))))) {
        this->last_click_element = this->active;
        this->last_click_time = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        bVar2 = true;
      }
      else {
        if (this->hover == (Element *)0x0) {
          bVar2 = true;
        }
        else {
          bVar2 = Element::DispatchEvent(this->hover,Dblclick,&local_68);
        }
        this->last_click_element = (Element *)0x0;
        this->last_click_time = 0.0;
      }
LAB_001e8892:
      this->last_click_mouse_position = this->mouse_position;
      ::std::vector<Rml::Element*,std::allocator<Rml::Element*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Rml::Element**,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>>
                ((vector<Rml::Element*,std::allocator<Rml::Element*>> *)&this->active_chain,
                 (this->active_chain).
                 super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (this->hover_chain).m_container.
                 super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (this->hover_chain).m_container.
                 super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (bVar2 != false) {
        this->drag_started = false;
        pEVar3 = this->hover;
        this->drag = pEVar3;
        if (pEVar3 != (Element *)0x0) {
          do {
            pCVar5 = Element::GetComputedValues(pEVar3);
            uVar6 = *(uint *)&pCVar5->rare >> 0x14;
            if ((uVar6 & 7) != 0) {
              if ((uVar6 & 7) == 3) {
                this->drag = (Element *)0x0;
              }
              else {
                this->drag_verbose = (((byte)uVar6 & 7) - 2 & 0xfd) == 0;
              }
              break;
            }
            pEVar3 = Element::GetParentNode(this->drag);
            this->drag = pEVar3;
          } while (pEVar3 != (Element *)0x0);
          goto LAB_001e8756;
        }
      }
      pSVar8 = (this->scroll_controller)._M_t.
               super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
               .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl;
      if (pSVar8->mode == Autoscroll) goto LAB_001e892b;
      goto LAB_001e8930;
    }
    pEVar3 = FindFocusElement(pEVar3);
    if (((pEVar3 == (Element *)0x0) || (pEVar3 == this->focus)) ||
       (bVar2 = Element::Focus(pEVar3,false), bVar2)) {
      this->active = pEVar3;
      if ((this->hover == (Element *)0x0) ||
         (bVar2 = Element::DispatchEvent(this->hover,Mousedown,&local_68), bVar2))
      goto LAB_001e883e;
      bVar2 = false;
      goto LAB_001e8892;
    }
    pEVar3 = (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
             _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
             super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
    if ((this->hover != pEVar3 && this->hover != (Element *)0x0) ||
       (this->active != pEVar3 && this->active != (Element *)0x0)) goto LAB_001e8a65;
  }
  else {
    if (pEVar3 == (Element *)0x0) {
      bVar2 = true;
    }
    else {
      bVar2 = Element::DispatchEvent(pEVar3,Mousedown,&local_68);
    }
LAB_001e8756:
    pSVar8 = (this->scroll_controller)._M_t.
             super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
             ._M_t.
             super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
             .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl;
    if (pSVar8->mode == Autoscroll) {
LAB_001e892b:
      ScrollController::Reset(pSVar8);
    }
    else if (((button_index == 2) && (this->hover != (Element *)0x0)) && (bVar2 != false)) {
      local_48.m_container.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.m_container.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.m_container.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pCVar7 = this;
      GenerateMouseEventParameters(this,&local_48,-1);
      GenerateKeyModifierEventParameters(pCVar7,&local_48,key_modifier_state);
      this_00 = itlib::
                flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                ::operator[]<char_const(&)[11]>
                          ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                            *)&local_48,(char (*) [11])"autoscroll");
      Variant::Clear(this_00);
      Variant::Set(this_00,true);
      bVar2 = Element::DispatchEvent(this->hover,Mousescroll,&local_48);
      if (bVar2) {
        pSVar8 = (this->scroll_controller)._M_t.
                 super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
                 .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl;
        pEVar3 = Element::GetClosestScrollableContainer(this->hover);
        ScrollController::ActivateAutoscroll(pSVar8,pEVar3,this->mouse_position);
      }
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ::~vector(&local_48.m_container);
    }
LAB_001e8930:
    pEVar3 = (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
             _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
             super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
    if ((this->hover != pEVar3 && this->hover != (Element *)0x0) ||
       (this->active != pEVar3 && this->active != (Element *)0x0)) {
LAB_001e8a65:
      bVar2 = false;
      goto LAB_001e8a67;
    }
  }
  bVar2 = ((this->scroll_controller)._M_t.
           super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
           ._M_t.
           super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
           .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl)->mode != Autoscroll;
LAB_001e8a67:
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_68.m_container);
  return bVar2;
}

Assistant:

bool Context::ProcessMouseButtonDown(int button_index, int key_modifier_state)
{
	Dictionary parameters;
	GenerateMouseEventParameters(parameters, button_index);
	GenerateKeyModifierEventParameters(parameters, key_modifier_state);

	bool propagate = true;

	if (button_index == 0)
	{
		Element* new_focus = hover;

		// Set the currently hovered element to focus if it isn't already the focus.
		if (hover)
		{
			new_focus = FindFocusElement(hover);
			if (new_focus && new_focus != focus)
			{
				if (!new_focus->Focus())
					return !IsMouseInteracting();
			}
		}

		// Save the just-pressed-on element as the pressed element.
		active = new_focus;

		// Call 'onmousedown' on every item in the hover chain, and copy the hover chain to the active chain.
		if (hover)
			propagate = hover->DispatchEvent(EventId::Mousedown, parameters);

		if (propagate)
		{
			// Check for a double-click on an element; if one has occured, we send the 'dblclick' event to the hover
			// element. If not, we'll start a timer to catch the next one.
			float mouse_distance_squared = float((mouse_position - last_click_mouse_position).SquaredMagnitude());
			float max_mouse_distance = DOUBLE_CLICK_MAX_DIST * density_independent_pixel_ratio;

			double click_time = GetSystemInterface()->GetElapsedTime();

			if (active == last_click_element && float(click_time - last_click_time) < DOUBLE_CLICK_TIME &&
				mouse_distance_squared < max_mouse_distance * max_mouse_distance)
			{
				if (hover)
					propagate = hover->DispatchEvent(EventId::Dblclick, parameters);

				last_click_element = nullptr;
				last_click_time = 0;
			}
			else
			{
				last_click_element = active;
				last_click_time = click_time;
			}
		}

		last_click_mouse_position = mouse_position;

		active_chain.insert(active_chain.end(), hover_chain.begin(), hover_chain.end());

		if (propagate)
		{
			// Traverse down the hierarchy of the newly focused element (if any), and see if we can begin dragging it.
			drag_started = false;
			drag = hover;
			while (drag)
			{
				Style::Drag drag_style = drag->GetComputedValues().drag();
				switch (drag_style)
				{
				case Style::Drag::None: drag = drag->GetParentNode(); continue;
				case Style::Drag::Block: drag = nullptr; continue;
				default: drag_verbose = (drag_style == Style::Drag::DragDrop || drag_style == Style::Drag::Clone);
				}

				break;
			}
		}
	}
	else
	{
		// Not the primary mouse button, so we're not doing any special processing.
		if (hover)
			propagate = hover->DispatchEvent(EventId::Mousedown, parameters);
	}

	if (scroll_controller->GetMode() == ScrollController::Mode::Autoscroll)
	{
		scroll_controller->Reset();
	}
	else if (button_index == 2 && hover && propagate)
	{
		Dictionary scroll_parameters;
		GenerateMouseEventParameters(scroll_parameters);
		GenerateKeyModifierEventParameters(scroll_parameters, key_modifier_state);
		scroll_parameters["autoscroll"] = true;

		// Dispatch a mouse scroll event, this gives elements an opportunity to block autoscroll from being initialized.
		if (hover->DispatchEvent(EventId::Mousescroll, scroll_parameters))
			scroll_controller->ActivateAutoscroll(hover->GetClosestScrollableContainer(), mouse_position);
	}

	return !IsMouseInteracting();
}